

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenAtomicNotify
          (BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef notifyCount,
          char *memoryName)

{
  AtomicNotify *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (AtomicNotify *)MixedArena::allocSpace(&module->allocator,0x38,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression.type.id = 0;
  this->notifyCount = (Expression *)0x0;
  (this->memory).super_IString.str._M_len = 0;
  (this->offset).addr = 0;
  this->ptr = (Expression *)0x0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression._id = AtomicNotifyId;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)27>).super_Expression.type.id = 0;
  (this->offset).addr = 0;
  this->ptr = ptr;
  this->notifyCount = notifyCount;
  wasm::AtomicNotify::finalize(this);
  (this->memory).super_IString.str = sVar1;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicNotify(BinaryenModuleRef module,
                                           BinaryenExpressionRef ptr,
                                           BinaryenExpressionRef notifyCount,
                                           const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicNotify((Expression*)ptr,
                        (Expression*)notifyCount,
                        0,
                        getMemoryName(module, memoryName)));
}